

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t COVER_buildDictionary
                 (COVER_ctx_t *ctx,U32 *freqs,COVER_map_t *activeDmers,void *dictBuffer,
                 size_t dictBufferCapacity,ZDICT_cover_params_t parameters)

{
  ZDICT_cover_params_t parameters_00;
  COVER_epoch_info_t CVar1;
  clock_t cVar2;
  long in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  U32 *in_R8;
  COVER_segment_t CVar3;
  uint in_stack_0000000c;
  COVER_segment_t segment;
  size_t segmentSize;
  U32 epochEnd;
  U32 epochBegin;
  size_t epoch;
  size_t zeroScoreRun;
  size_t maxZeroScoreRun;
  COVER_epoch_info_t epochs;
  size_t tail;
  BYTE *dict;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  U32 *local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  ulong local_88;
  U32 local_80;
  U32 in_stack_ffffffffffffff88;
  U32 in_stack_ffffffffffffff8c;
  U32 in_stack_ffffffffffffff90;
  U32 in_stack_ffffffffffffff94;
  U32 *in_stack_ffffffffffffff98;
  ulong local_58;
  ulong local_50;
  uint uVar4;
  uint uVar5;
  U32 *pUVar6;
  long lVar7;
  
  pUVar6 = in_R8;
  lVar7 = in_RCX;
  CVar1 = COVER_computeEpochs((U32)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                              (U32)in_stack_ffffffffffffff38,
                              (U32)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                              (U32)in_stack_ffffffffffffff30);
  uVar4 = CVar1.num;
  uVar5 = CVar1.size;
  if (uVar4 >> 3 < 0x65) {
    local_94 = uVar4 >> 3;
  }
  else {
    local_94 = 100;
  }
  if (local_94 < 10) {
    local_98 = 10;
  }
  else {
    if (uVar4 >> 3 < 0x65) {
      local_9c = uVar4 >> 3;
    }
    else {
      local_9c = 100;
    }
    local_98 = local_9c;
  }
  local_50 = 0;
  local_80 = in_stack_ffffffffffffff94;
  local_a8 = in_stack_ffffffffffffff98;
  if (1 < g_displayLevel) {
    fprintf(_stderr,"Breaking content into %u epochs of size %u\n",(ulong)CVar1 & 0xffffffff,
            (ulong)uVar5);
    fflush(_stderr);
    local_80 = in_stack_ffffffffffffff94;
    local_a8 = in_stack_ffffffffffffff98;
  }
  local_58 = 0;
  while (in_R8 != (U32 *)0x0) {
    parameters_00.d = uVar5;
    parameters_00.k = uVar4;
    parameters_00._8_8_ = in_R8;
    parameters_00.splitPoint = (double)in_RCX;
    parameters_00._24_8_ = pUVar6;
    parameters_00.zParams.compressionLevel = (int)lVar7;
    parameters_00.zParams.notificationLevel = (int)((ulong)lVar7 >> 0x20);
    parameters_00._40_8_ = in_RDX;
    CVar3 = COVER_selectSegment((COVER_ctx_t *)
                                CONCAT44((int)local_58 * uVar5,(int)local_58 * uVar5 + uVar5),
                                local_a8,(COVER_map_t *)CONCAT44(local_80,in_stack_ffffffffffffff90)
                                ,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,parameters_00);
    local_88 = CVar3._0_8_;
    in_stack_ffffffffffffff8c = CVar3.begin;
    in_stack_ffffffffffffff90 = CVar3.end;
    local_80 = CVar3.score;
    if (local_80 == 0) {
      local_50 = local_50 + 1;
      if (local_98 <= local_50) break;
    }
    else {
      local_50 = 0;
      local_a8 = in_R8;
      if ((U32 *)(ulong)(((in_stack_ffffffffffffff90 - in_stack_ffffffffffffff8c) +
                         in_stack_0000000c) - 1) < in_R8) {
        local_a8 = (U32 *)(ulong)(((in_stack_ffffffffffffff90 - in_stack_ffffffffffffff8c) +
                                  in_stack_0000000c) - 1);
      }
      if (local_a8 < (U32 *)(ulong)in_stack_0000000c) break;
      in_R8 = (U32 *)((long)in_R8 - (long)local_a8);
      memcpy((void *)(in_RCX + (long)in_R8),(void *)(*in_RDI + (local_88 & 0xffffffff)),
             (size_t)local_a8);
      if ((1 < g_displayLevel) &&
         ((cVar2 = clock(), 150000 < cVar2 - g_time || (3 < g_displayLevel)))) {
        g_time = clock();
        fprintf(_stderr,"\r%u%%       ",
                (ulong)(((long)pUVar6 - (long)in_R8) * 100) / (ulong)pUVar6 & 0xffffffff);
        fflush(_stderr);
      }
    }
    local_58 = (local_58 + 1) % (ulong)uVar4;
  }
  if (1 < g_displayLevel) {
    fprintf(_stderr,"\r%79s\r","");
    fflush(_stderr);
  }
  return (size_t)in_R8;
}

Assistant:

static size_t COVER_buildDictionary(const COVER_ctx_t *ctx, U32 *freqs,
                                    COVER_map_t *activeDmers, void *dictBuffer,
                                    size_t dictBufferCapacity,
                                    ZDICT_cover_params_t parameters) {
  BYTE *const dict = (BYTE *)dictBuffer;
  size_t tail = dictBufferCapacity;
  /* Divide the data into epochs. We will select one segment from each epoch. */
  const COVER_epoch_info_t epochs = COVER_computeEpochs(
      (U32)dictBufferCapacity, (U32)ctx->suffixSize, parameters.k, 4);
  const size_t maxZeroScoreRun = MAX(10, MIN(100, epochs.num >> 3));
  size_t zeroScoreRun = 0;
  size_t epoch;
  DISPLAYLEVEL(2, "Breaking content into %u epochs of size %u\n",
                (U32)epochs.num, (U32)epochs.size);
  /* Loop through the epochs until there are no more segments or the dictionary
   * is full.
   */
  for (epoch = 0; tail > 0; epoch = (epoch + 1) % epochs.num) {
    const U32 epochBegin = (U32)(epoch * epochs.size);
    const U32 epochEnd = epochBegin + epochs.size;
    size_t segmentSize;
    /* Select a segment */
    COVER_segment_t segment = COVER_selectSegment(
        ctx, freqs, activeDmers, epochBegin, epochEnd, parameters);
    /* If the segment covers no dmers, then we are out of content.
     * There may be new content in other epochs, for continue for some time.
     */
    if (segment.score == 0) {
      if (++zeroScoreRun >= maxZeroScoreRun) {
          break;
      }
      continue;
    }
    zeroScoreRun = 0;
    /* Trim the segment if necessary and if it is too small then we are done */
    segmentSize = MIN(segment.end - segment.begin + parameters.d - 1, tail);
    if (segmentSize < parameters.d) {
      break;
    }
    /* We fill the dictionary from the back to allow the best segments to be
     * referenced with the smallest offsets.
     */
    tail -= segmentSize;
    memcpy(dict + tail, ctx->samples + segment.begin, segmentSize);
    DISPLAYUPDATE(
        2, "\r%u%%       ",
        (unsigned)(((dictBufferCapacity - tail) * 100) / dictBufferCapacity));
  }
  DISPLAYLEVEL(2, "\r%79s\r", "");
  return tail;
}